

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
Lodtalk::TemporalVariableLookup::generateStore
          (TemporalVariableLookup *this,Assembler *gen,FunctionalNode *functionalContext)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  
  iVar2 = (*(this->super_VariableLookup)._vptr_VariableLookup[3])();
  if ((char)iVar2 == '\0') {
    __assert_fail("isMutable()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/Compiler.cpp"
                  ,0xc3,
                  "virtual void Lodtalk::TemporalVariableLookup::generateStore(MethodAssembler::Assembler &, FunctionalNode *) const"
                 );
  }
  iVar2 = this->temporalIndex;
  if (-1 < iVar2) {
    iVar1 = this->temporalVectorIndex;
    if (-1 < iVar1) {
      sVar3 = AST::FunctionalNode::getArgumentCount(functionalContext);
      MethodAssembler::Assembler::storeTemporalInVector(gen,iVar2,iVar1 + (int)sVar3);
      return;
    }
    MethodAssembler::Assembler::storeTemporal(gen,iVar2);
    return;
  }
  __assert_fail("temporalIndex >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ronsaldo[P]lodtalk/vm/Compiler.cpp"
                ,0xc4,
                "virtual void Lodtalk::TemporalVariableLookup::generateStore(MethodAssembler::Assembler &, FunctionalNode *) const"
               );
}

Assistant:

virtual void generateStore(MethodAssembler::Assembler &gen, FunctionalNode *functionalContext) const
    {
        assert(isMutable());
        assert(temporalIndex >= 0);
        if(temporalVectorIndex >= 0)
        {
            gen.storeTemporalInVector(temporalIndex, temporalVectorIndex + (int)functionalContext->getArgumentCount());
        }
        else
        {
            gen.storeTemporal(temporalIndex);
        }
    }